

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O2

void lj_mcode_limiterr(jit_State *J,size_t need)

{
  TraceError e;
  ulong uVar1;
  
  lj_mcode_abort(J);
  uVar1 = (long)J->param[0xc] * 0x400 + 0xfffU & 0xfffffffffffff000;
  if (uVar1 < need) {
    e = LJ_TRERR_MCODEOV;
  }
  else if ((ulong)((long)J->param[0xd] * 0x400) < uVar1 + J->szallmcarea) {
    e = LJ_TRERR_MCODEAL;
  }
  else {
    mcode_allocarea(J);
    e = LJ_TRERR_MCODELM;
  }
  lj_trace_err(J,e);
}

Assistant:

void lj_mcode_limiterr(jit_State *J, size_t need)
{
  size_t sizemcode, maxmcode;
  lj_mcode_abort(J);
  sizemcode = (size_t)J->param[JIT_P_sizemcode] << 10;
  sizemcode = (sizemcode + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  maxmcode = (size_t)J->param[JIT_P_maxmcode] << 10;
  if ((size_t)need > sizemcode)
    lj_trace_err(J, LJ_TRERR_MCODEOV);  /* Too long for any area. */
  if (J->szallmcarea + sizemcode > maxmcode)
    lj_trace_err(J, LJ_TRERR_MCODEAL);
  mcode_allocarea(J);
  lj_trace_err(J, LJ_TRERR_MCODELM);  /* Retry with new area. */
}